

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_pwd.c
# Opt level: O0

err_t cmdPwdGen(cmd_pwd_t *pwd,char *cmdline)

{
  bool_t bVar1;
  size_t sVar2;
  char *in_RSI;
  cmd_pwd_t *in_RDI;
  char *in_stack_00000020;
  cmd_pwd_t *in_stack_00000028;
  err_t local_4;
  
  bVar1 = strStartsWith(in_RSI,"pass:");
  if (bVar1 == 0) {
    bVar1 = strStartsWith(in_RSI,"env:");
    if (bVar1 == 0) {
      bVar1 = strStartsWith(in_RSI,"share:");
      if (bVar1 == 0) {
        local_4 = 0x25b;
      }
      else {
        strLen((char *)0x106f62);
        local_4 = cmdPwdGenShare(in_stack_00000028,in_stack_00000020);
      }
    }
    else {
      sVar2 = strLen((char *)0x106f15);
      local_4 = cmdPwdGenEnv(in_RDI,in_RSI + sVar2);
    }
  }
  else {
    sVar2 = strLen((char *)0x106ec4);
    local_4 = cmdPwdGenPass(in_RDI,in_RSI + sVar2);
  }
  return local_4;
}

Assistant:

err_t cmdPwdGen(cmd_pwd_t* pwd, const char* cmdline)
{
	if (strStartsWith(cmdline, "pass:"))
		return cmdPwdGenPass(pwd, cmdline + strLen("pass:"));
	else if (strStartsWith(cmdline, "env:"))
		return cmdPwdGenEnv(pwd, cmdline + strLen("env:"));
	else if (strStartsWith(cmdline, "share:"))
		return cmdPwdGenShare(pwd, cmdline + strLen("share:"));
	return ERR_CMD_PARAMS;
}